

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool testing::internal::TupleMatches<std::tuple<testing::Matcher<bool>>,std::tuple<bool>>
               (tuple<testing::Matcher<bool>_> *matcher_tuple,tuple<bool> *value_tuple)

{
  bool bVar1;
  tuple<bool> *value_tuple_local;
  tuple<testing::Matcher<bool>_> *matcher_tuple_local;
  
  bVar1 = TuplePrefix<1ul>::Matches<std::tuple<testing::Matcher<bool>>,std::tuple<bool>>
                    (matcher_tuple,value_tuple);
  return bVar1;
}

Assistant:

bool TupleMatches(const MatcherTuple& matcher_tuple,
                  const ValueTuple& value_tuple) {
  // Makes sure that matcher_tuple and value_tuple have the same
  // number of fields.
  GTEST_COMPILE_ASSERT_(std::tuple_size<MatcherTuple>::value ==
                            std::tuple_size<ValueTuple>::value,
                        matcher_and_value_have_different_numbers_of_fields);
  return TuplePrefix<std::tuple_size<ValueTuple>::value>::Matches(matcher_tuple,
                                                                  value_tuple);
}